

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_p.h
# Opt level: O2

void __thiscall QStorageInfoPrivate::~QStorageInfoPrivate(QStorageInfoPrivate *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->name).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->fileSystemType).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->subvolume).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->device).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->rootPath).d);
  return;
}

Assistant:

QStorageInfoPrivate() = default;